

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O2

long gimage::cmp<unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *diff,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *im1,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *im2,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *tol)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_short ***pppuVar3;
  unsigned_short ***pppuVar4;
  unsigned_short ***pppuVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  
  lVar6 = -1;
  if (((im1->width == im2->width) && (im1->height == im2->height)) && (im1->depth == im2->depth)) {
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
              (diff,im1->width,im1->height,(long)im1->depth);
    puVar1 = (tol->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (tol->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar10 = 0;
    uVar9 = im1->height;
    if (im1->height < 1) {
      uVar9 = uVar10;
    }
    uVar7 = (ulong)(uint)im1->depth;
    if (im1->depth < 1) {
      uVar7 = uVar10;
    }
    uVar14 = 0;
    lVar6 = 0;
    for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
      if ((long)uVar13 < (long)(int)((ulong)((long)puVar2 - (long)puVar1) >> 1)) {
        uVar14 = (uint)puVar1[uVar13];
      }
      uVar15 = im1->width;
      if (im1->width < 1) {
        uVar15 = uVar10;
      }
      for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
        pppuVar3 = im1->img;
        pppuVar4 = im2->img;
        pppuVar5 = diff->img;
        for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
          uVar11 = (uint)pppuVar3[uVar13][uVar16][uVar8] - (uint)pppuVar4[uVar13][uVar16][uVar8];
          lVar6 = lVar6 + (ulong)((int)uVar14 < (int)uVar11);
          uVar12 = (ulong)uVar11;
          if ((int)uVar11 < 1) {
            uVar12 = uVar10;
          }
          pppuVar5[uVar13][uVar16][uVar8] = (unsigned_short)uVar12;
        }
      }
    }
  }
  return lVar6;
}

Assistant:

long cmp(Image<T> &diff, const Image<T> &im1,
                           const Image<T> &im2, const std::vector<T> &tol)
{
  if (im1.getWidth() != im2.getWidth() || im1.getHeight() != im2.getHeight() ||
      im1.getDepth() != im2.getDepth())
  {
    return -1;
  }

  diff.setSize(im1.getWidth(), im1.getHeight(), im1.getDepth());

  long ret=0;
  typename Image<T>::work_t t=0;

  for (int d=0; d<im1.getDepth(); d++)
  {
    if (d < static_cast<int>(tol.size()))
    {
      t=tol[d];
    }

    for (long k=0; k<im1.getHeight(); k++)
    {
      for (long i=0; i<im1.getWidth(); i++)
      {
        typename Image<T>::work_t v1=im1.getW(i, k, d);
        typename Image<T>::work_t v2=im2.getW(i, k, d);
        typename Image<T>::work_t v;

        if (im1.isValidW(v1) && im2.isValidW(v2))
        {
          v=v1-v2;
        }
        else if (!im1.isValidW(v1) && !im2.isValidW(v2))
        {
          v=0;
        }
        else
        {
          v=Image<T>::ptraits::invalid();
        }

//        if (v < 0)
//        {
//          v=-v;
//        }

        if (v > t)
        {
          ret++;
        }

        diff.setLimited(i, k, d, v);
      }
    }
  }

  return ret;
}